

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prodcons4.c
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  long lVar6;
  pthread_t *ppVar7;
  int val_mutex;
  int val_empty;
  int val_stored;
  int count_c [100];
  int count_p [100];
  pthread_t tid_consumer [100];
  pthread_t tid_producer [100];
  
  if (argc != 4) {
    fprintf(_stderr,"[%s:%d]",
            "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch10/prodcons4.c"
            ,0x20);
    err_quit("usage: %s [#items] [#producers] [#consumers]",*argv);
  }
  nitems = atoi(argv[1]);
  nproducers = atoi(argv[2]);
  nconsumers = atoi(argv[3]);
  uVar1 = _FILE_MODE;
  shared.mutex = (sem_t *)sem_open("/sem_mutex",0xc0,(ulong)_FILE_MODE,1);
  shared.nempty = (sem_t *)sem_open("/sem_nempty",0xc0,(ulong)uVar1,10);
  shared.nstored = (sem_t *)sem_open("/sem_nstored",0xc0,(ulong)uVar1,0);
  if (shared.mutex == (sem_t *)0x0) {
    fprintf(_stderr,"[%s:%d]",
            "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch10/prodcons4.c"
            ,0x2a);
    __errno_location();
    err_quit("Failed to create semaphore mutex: %d");
  }
  if (shared.nempty == (sem_t *)0x0) {
    fprintf(_stderr,"[%s:%d]",
            "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch10/prodcons4.c"
            ,0x2b);
    __errno_location();
    err_quit("Failed to create semaphore nempty: %d");
  }
  if (shared.nstored == (sem_t *)0x0) {
    fprintf(_stderr,"[%s:%d]",
            "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch10/prodcons4.c"
            ,0x2c);
    __errno_location();
    err_quit("Failed to create semaphore nstored: %d");
  }
  shared.nput = 0;
  shared.nputval = 0;
  shared.nget = 0;
  shared.ngetval = 0;
  piVar5 = count_p;
  ppVar7 = tid_producer;
  for (lVar6 = 0; lVar6 < nproducers; lVar6 = lVar6 + 1) {
    iVar2 = pthread_create(ppVar7,(pthread_attr_t *)0x0,producer,piVar5);
    if (iVar2 != 0) {
      fprintf(_stderr,"[%s:%d]",
              "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch10/prodcons4.c"
              ,0x35);
      err_quit("Failed to create producer thread");
    }
    piVar5 = piVar5 + 1;
    ppVar7 = ppVar7 + 1;
  }
  piVar5 = count_c;
  ppVar7 = tid_consumer;
  for (lVar6 = 0; lVar6 < nconsumers; lVar6 = lVar6 + 1) {
    iVar2 = pthread_create(ppVar7,(pthread_attr_t *)0x0,consumer,piVar5);
    if (iVar2 != 0) {
      fprintf(_stderr,"[%s:%d]",
              "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch10/prodcons4.c"
              ,0x39);
      err_quit("Failed to create consumer thread");
    }
    piVar5 = piVar5 + 1;
    ppVar7 = ppVar7 + 1;
  }
  iVar2 = 0;
  for (lVar6 = 0; lVar6 < nproducers; lVar6 = lVar6 + 1) {
    iVar3 = pthread_join(tid_producer[lVar6],(void **)0x0);
    if (iVar3 != 0) {
      fprintf(_stderr,"[%s:%d]",
              "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch10/prodcons4.c"
              ,0x3f);
      err_quit("Failed to join producer thread: %ld",tid_producer[lVar6]);
    }
    iVar2 = iVar2 + count_p[lVar6];
    printf("count_p[%d] = %d\n");
  }
  iVar3 = sem_post((sem_t *)shared.nstored);
  if (iVar3 != 0) {
    fprintf(_stderr,"[%s:%d]",
            "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch10/prodcons4.c"
            ,0x43);
    err_quit("Failed to post to nstored");
  }
  iVar3 = 0;
  for (lVar6 = 0; lVar6 < nconsumers; lVar6 = lVar6 + 1) {
    iVar4 = pthread_join(tid_consumer[lVar6],(void **)0x0);
    if (iVar4 != 0) {
      fprintf(_stderr,"[%s:%d]",
              "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch10/prodcons4.c"
              ,0x46);
      err_quit("Failed to join consumer thread: %ld",tid_consumer[lVar6]);
    }
    iVar3 = iVar3 + count_c[lVar6];
    printf("count_c[%d] = %d\n");
  }
  iVar4 = sem_wait((sem_t *)shared.nstored);
  if (iVar4 != 0) {
    fprintf(_stderr,"[%s:%d]",
            "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch10/prodcons4.c"
            ,0x4a);
    err_quit("Failed to wait for nstored");
  }
  val_empty = 0;
  val_stored = 0;
  val_mutex = 0;
  iVar4 = sem_getvalue((sem_t *)shared.nstored,&val_stored);
  if (iVar4 != 0) {
    fprintf(_stderr,"[%s:%d]",
            "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch10/prodcons4.c"
            ,0x4e);
    err_sys("Failed to get value of nstored");
  }
  iVar4 = sem_getvalue((sem_t *)shared.nempty,&val_empty);
  if (iVar4 != 0) {
    fprintf(_stderr,"[%s:%d]",
            "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch10/prodcons4.c"
            ,0x4f);
    err_sys("Failed to get value of nempty");
  }
  iVar4 = sem_getvalue((sem_t *)shared.mutex,&val_mutex);
  if (iVar4 != 0) {
    fprintf(_stderr,"[%s:%d]",
            "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch10/prodcons4.c"
            ,0x50);
    err_sys("Failed to get value of stored");
  }
  if (((val_empty != 10) || (val_stored != 0)) || (val_mutex != 1)) {
    fprintf(_stderr,"[%s:%d]",
            "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch10/prodcons4.c"
            ,0x53);
    err_sys("logic error: empty = %d, stored = %d, mutex = %d",val_empty,val_stored,val_mutex);
  }
  iVar4 = sem_unlink("/sem_mutex");
  if (iVar4 != 0) {
    fprintf(_stderr,"[%s:%d]",
            "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch10/prodcons4.c"
            ,0x56);
    err_quit("Failed to unlink semaphore mutex");
  }
  iVar4 = sem_unlink("/sem_nempty");
  if (iVar4 != 0) {
    fprintf(_stderr,"[%s:%d]",
            "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch10/prodcons4.c"
            ,0x57);
    err_quit("Failed to unlink semaphore nempty");
  }
  iVar4 = sem_unlink("/sem_nstored");
  if (iVar4 != 0) {
    fprintf(_stderr,"[%s:%d]",
            "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch10/prodcons4.c"
            ,0x58);
    err_quit("Failed to unlink semaphore nstored");
  }
  if (iVar2 != nitems) {
    fprintf(_stderr,"[%s:%d]",
            "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch10/prodcons4.c"
            ,0x5a);
    err_quit("total_p = %d, nitems = %d",iVar2,nitems);
    iVar2 = nitems;
  }
  if (iVar3 != iVar2) {
    fprintf(_stderr,"[%s:%d]",
            "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch10/prodcons4.c"
            ,0x5b);
    err_quit("total_c = %d, nitems = %d",iVar3,nitems);
  }
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  pthread_t tid_producer[MAXTHREADS], tid_consumer[MAXTHREADS];
  int i, count_p[MAXTHREADS], count_c[MAXTHREADS];

  ASSERT_ERR_QUIT(argc == 4, "usage: %s [#items] [#producers] [#consumers]", argv[0]);

  nitems = atoi(argv[1]);
  nproducers = atoi(argv[2]);
  nconsumers = atoi(argv[3]);

  shared.mutex = sem_open(SEM_MUTEX, O_CREAT | O_EXCL, FILE_MODE, 1);
  shared.nempty = sem_open(SEM_NEMPTY, O_CREAT | O_EXCL, FILE_MODE, NBUFF);
  shared.nstored = sem_open(SEM_NSTORED, O_CREAT | O_EXCL, FILE_MODE, 0);

  ASSERT_ERR_QUIT(shared.mutex != SEM_FAILED, "Failed to create semaphore mutex: %d", errno);
  ASSERT_ERR_QUIT(shared.nempty != SEM_FAILED, "Failed to create semaphore nempty: %d", errno);
  ASSERT_ERR_QUIT(shared.nstored != SEM_FAILED, "Failed to create semaphore nstored: %d", errno);

  shared.nput = 0;
  shared.nputval = 0;  
  shared.nget = 0;
  shared.ngetval = 0;

  for (i = 0; i < nproducers; ++i) {
    ASSERT_ERR_QUIT(pthread_create(&tid_producer[i], NULL, &producer, &count_p[i]) == 0, 
      "Failed to create producer thread");
  }
  for (i = 0; i < nconsumers; ++i) {
    ASSERT_ERR_QUIT(pthread_create(&tid_consumer[i], NULL, &consumer, &count_c[i]) == 0,
      "Failed to create consumer thread");
  }
  int total_p = 0, total_c = 0;

  for (i = 0; i < nproducers; ++i) {
    ASSERT_ERR_QUIT(pthread_join(tid_producer[i], NULL) == 0, 
      "Failed to join producer thread: %ld", tid_producer[i]);
    total_p += count_p[i];
    printf("count_p[%d] = %d\n", i, count_p[i]);
  }
  ASSERT_ERR_QUIT(sem_post(shared.nstored) == 0, "Failed to post to nstored");
  for (i = 0; i < nconsumers; ++i) {
    ASSERT_ERR_QUIT(pthread_join(tid_consumer[i], NULL) == 0, 
      "Failed to join consumer thread: %ld", tid_consumer[i]);
    total_c += count_c[i];
    printf("count_c[%d] = %d\n", i, count_c[i]);
  }
  ASSERT_ERR_QUIT(sem_wait(shared.nstored) == 0, "Failed to wait for nstored");

#if __linux__
  int val_empty = 0, val_stored = 0, val_mutex = 0;
  ASSERT_ERR_SYS(sem_getvalue(shared.nstored, &val_stored) == 0, "Failed to get value of nstored");
  ASSERT_ERR_SYS(sem_getvalue(shared.nempty, &val_empty) == 0, "Failed to get value of nempty");
  ASSERT_ERR_SYS(sem_getvalue(shared.mutex, &val_mutex) == 0, "Failed to get value of stored");

  ASSERT_ERR_SYS(val_empty == NBUFF && val_stored == 0 && val_mutex == 1, 
    "logic error: empty = %d, stored = %d, mutex = %d", val_empty, val_stored, val_mutex);
#endif

  ASSERT_ERR_QUIT(0 == sem_unlink(SEM_MUTEX), "Failed to unlink semaphore mutex");
  ASSERT_ERR_QUIT(0 == sem_unlink(SEM_NEMPTY), "Failed to unlink semaphore nempty");
  ASSERT_ERR_QUIT(0 == sem_unlink(SEM_NSTORED), "Failed to unlink semaphore nstored");

  ASSERT_ERR_QUIT(total_p == nitems, "total_p = %d, nitems = %d", total_p, nitems);
  ASSERT_ERR_QUIT(total_c == nitems, "total_c = %d, nitems = %d", total_c, nitems);
  return 0;
}